

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

void Extra_zddDumpPla(DdManager *dd,DdNode *F,int nVars,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  int local_54;
  FILE *pFile;
  int *piStack_40;
  int i;
  int *pPath;
  char *pCube;
  DdGen *gen;
  char *pFileName_local;
  DdNode *pDStack_18;
  int nVars_local;
  DdNode *F_local;
  DdManager *dd_local;
  
  gen = (DdGen *)pFileName;
  pFileName_local._4_4_ = nVars;
  pDStack_18 = F;
  F_local = &dd->sentinel;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",gen);
  }
  else {
    fprintf(__stream,"# PLA file dumped by Extra_zddDumpPla() in ABC\n");
    fprintf(__stream,".i %d\n",(ulong)pFileName_local._4_4_);
    fprintf(__stream,".o 1\n");
    pPath = (int *)calloc((long)*(int *)((long)&F_local[3].type + 4),1);
    pCube = (char *)Cudd_zddFirstPath((DdManager *)F_local,pDStack_18,&stack0xffffffffffffffc0);
    while( true ) {
      iVar1 = Cudd_IsGenEmpty((DdGen *)pCube);
      if (iVar1 == 0) {
        local_54 = 1;
      }
      else {
        local_54 = Cudd_GenFree((DdGen *)pCube);
      }
      if (local_54 == 0) break;
      for (pFile._4_4_ = 0; pFile._4_4_ < (int)pFileName_local._4_4_; pFile._4_4_ = pFile._4_4_ + 1)
      {
        *(undefined1 *)((long)pPath + (long)pFile._4_4_) = 0x2d;
      }
      for (pFile._4_4_ = 0; pFile._4_4_ < (int)pFileName_local._4_4_; pFile._4_4_ = pFile._4_4_ + 1)
      {
        if ((piStack_40[pFile._4_4_ << 1] == 1) || (piStack_40[pFile._4_4_ * 2 + 1] == 1)) {
          *(char *)((long)pPath + (long)pFile._4_4_) = (piStack_40[pFile._4_4_ << 1] == 1) + '0';
        }
      }
      fprintf(__stream,"%s 1\n",pPath);
      Cudd_zddNextPath((DdGen *)pCube,&stack0xffffffffffffffc0);
    }
    fprintf(__stream,".e\n\n");
    fclose(__stream);
    if (pPath != (int *)0x0) {
      free(pPath);
    }
  }
  return;
}

Assistant:

void Extra_zddDumpPla( DdManager * dd, DdNode * F, int nVars, char * pFileName )
{
    DdGen *gen;
    char * pCube;
    int * pPath, i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    fprintf( pFile, "# PLA file dumped by Extra_zddDumpPla() in ABC\n" );
    fprintf( pFile, ".i %d\n", nVars );
    fprintf( pFile, ".o 1\n" );
    pCube = ABC_CALLOC( char, dd->sizeZ );
    Cudd_zddForeachPath( dd, F, gen, pPath )
    {
        for ( i = 0; i < nVars; i++ )
            pCube[i] = '-';
        for ( i = 0; i < nVars; i++ )
            if ( pPath[2*i] == 1 || pPath[2*i+1] == 1 )
                pCube[i] = '0' + (pPath[2*i] == 1);
        fprintf( pFile, "%s 1\n", pCube );           
    }
    fprintf( pFile, ".e\n\n" );
    fclose( pFile );
    ABC_FREE( pCube );
}